

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# c_cvars.cpp
# Opt level: O3

UCVarValue __thiscall FFlagCVar::GetFavoriteRepDefault(FFlagCVar *this,ECVarType *type)

{
  uint uVar1;
  uint uVar2;
  undefined4 extraout_var;
  ECVarType dummy;
  undefined1 local_14 [4];
  
  uVar2 = (*(this->ValueVar->super_FBaseCVar)._vptr_FBaseCVar[7])(this->ValueVar,local_14);
  uVar1 = this->BitVal;
  *type = CVAR_Bool;
  return (char *)(CONCAT44(extraout_var,uVar2) & 0xffffffffffffff00 | (ulong)((uVar1 & uVar2) != 0))
  ;
}

Assistant:

UCVarValue FFlagCVar::GetFavoriteRepDefault (ECVarType *type) const
{
	ECVarType dummy;
	UCVarValue def;
	def = ValueVar.GetFavoriteRepDefault (&dummy);
	def.Bool = (def.Int & BitVal) != 0;
	*type = CVAR_Bool;
	return def;
}